

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void __thiscall CProficiencies::DisplayProfsForStat(CProficiencies *this,CHAR_DATA *imm)

{
  long *plVar1;
  pointer ppVar2;
  char *pcVar3;
  long lVar4;
  int *piVar5;
  char buf [4608];
  char buf2 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  sprintf(local_2438,"Proficiencies (%d pts left): ",(ulong)(uint)this->points);
  if ((prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
       super__Vector_impl_data._M_start)->name != (char *)0x0) {
    piVar5 = this->profs;
    lVar4 = 0x30;
    ppVar2 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*piVar5 != -1) {
        sprintf(local_1238,"%s (%d) ");
        strcat(local_2438,local_1238);
        ppVar2 = prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      plVar1 = (long *)((long)&ppVar2->ppsn + lVar4);
      piVar5 = piVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (*plVar1 != 0);
  }
  pcVar3 = palloc_string(local_2438);
  pcVar3 = format_string(pcVar3);
  send_to_char(pcVar3,imm);
  free_pstring(pcVar3);
  return;
}

Assistant:

void CProficiencies::DisplayProfsForStat(CHAR_DATA *imm)
{
	// auto points = GetPoints();
	// auto buffer = fmt::format("Proficiencies ({} pts left): \n\r", points);

	// auto prof_table_size = std::size(prof_table);
	// for (auto i = 0; i < prof_table_size; i++)
	// {
	// 	if (profs[i] == -1)
	// 		continue;

	// 	buffer += fmt::format("{} ({}) \n\r", prof_table[i].name, profs[i]);
	// }

	// buffer = std::string(format_string(buffer.data()));
	// send_to_char(buffer.c_str(), imm);

	// TODO: the above code causes a double free error, so using the old code for now
	// boo format_string(char*) boo!!!

	char buf[MSL], buf2[MSL];
	int i;
	sprintf(buf, "Proficiencies (%d pts left): ", GetPoints());
	for(i = 0; prof_table[i].name != nullptr; i++)
	{
		if(profs[i] == -1)
			continue;
		sprintf(buf2,"%s (%d) ", prof_table[i].name, profs[i]);
		strcat(buf, buf2);
	}
	char *fbuf = palloc_string(buf);
	fbuf = format_string(fbuf);
	send_to_char(fbuf, imm);
	free_pstring(fbuf);
}